

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_dss_initPEM
              (LIBSSH2_SESSION *session,char *privkeyfile,uchar *passphrase,void **abstract)

{
  int iVar1;
  EVP_PKEY *pEStack_38;
  int ret;
  EVP_PKEY *dsactx;
  void **abstract_local;
  uchar *passphrase_local;
  char *privkeyfile_local;
  LIBSSH2_SESSION *session_local;
  
  dsactx = (EVP_PKEY *)abstract;
  abstract_local = (void **)passphrase;
  passphrase_local = (uchar *)privkeyfile;
  privkeyfile_local = (char *)session;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_dss_dtor(session,abstract);
    *(undefined8 *)dsactx = 0;
  }
  iVar1 = _libssh2_dsa_new_private
                    (&stack0xffffffffffffffc8,(LIBSSH2_SESSION *)privkeyfile_local,
                     (char *)passphrase_local,(uchar *)abstract_local);
  if (iVar1 == 0) {
    *(EVP_PKEY **)dsactx = pEStack_38;
    session_local._4_4_ = 0;
  }
  else {
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_dss_initPEM(LIBSSH2_SESSION * session,
                               const char *privkeyfile,
                               unsigned const char *passphrase,
                               void **abstract)
{
    libssh2_dsa_ctx *dsactx;
    int ret;

    if(*abstract) {
        hostkey_method_ssh_dss_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_dsa_new_private(&dsactx, session, privkeyfile, passphrase);
    if(ret) {
        return -1;
    }

    *abstract = dsactx;

    return 0;
}